

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

int is_reserved(char *name)

{
  int iVar1;
  ushort **ppuVar2;
  char *local_20;
  char *s;
  char *name_local;
  
  iVar1 = strcmp(name,".");
  if (((iVar1 == 0) || (iVar1 = strcmp(name,"$accept"), iVar1 == 0)) ||
     (iVar1 = strcmp(name,"$end"), iVar1 == 0)) {
    name_local._4_4_ = 1;
  }
  else {
    if (((*name == '$') && (name[1] == '$')) &&
       (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)name[2]] & 0x800) != 0)) {
      local_20 = name + 3;
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_20] & 0x800) != 0) {
        local_20 = local_20 + 1;
      }
      if (*local_20 == '\0') {
        return 1;
      }
    }
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

int is_reserved(char *name)
{
    char *s;

    if (strcmp(name, ".") == 0 ||
	strcmp(name, "$accept") == 0 ||
	strcmp(name, "$end") == 0)
	return (1);

    if (name[0] == '$' && name[1] == '$' && isdigit(name[2])) {
	s = name + 3;
	while (isdigit(*s)) ++s;
	if (*s == NUL) return (1); }

    return (0);
}